

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O0

int __thiscall zmq::tcp_address_t::resolve(tcp_address_t *this,char *name_,bool local_,bool ipv6_)

{
  char *pcVar1;
  ulong uVar2;
  ip_resolver_options_t *piVar3;
  byte in_CL;
  byte in_DL;
  ip_resolver_options_t opts_;
  char *in_RSI;
  long in_RDI;
  ip_resolver_t resolver;
  ip_resolver_options_t resolver_opts;
  int rc;
  ip_resolver_t src_resolver;
  ip_resolver_options_t src_resolver_opts;
  string src_name;
  char *src_delimiter;
  undefined6 in_stack_00000108;
  ip_resolver_t local_a8;
  ip_resolver_options_t local_96;
  uint local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  bool local_7c;
  bool bStack_7b;
  ip_resolver_t local_78;
  ip_resolver_options_t local_62 [4];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  byte local_1a;
  byte local_19;
  char *local_18;
  int local_4;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_18 = in_RSI;
  local_28 = strrchr(in_RSI,0x3b);
  pcVar1 = local_18;
  if (local_28 != (char *)0x0) {
    uVar2 = (long)local_28 - (long)local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,uVar2,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    ip_resolver_options_t::ip_resolver_options_t(local_62);
    piVar3 = ip_resolver_options_t::bindable(local_62,true);
    piVar3 = ip_resolver_options_t::allow_dns(piVar3,false);
    piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,true);
    piVar3 = ip_resolver_options_t::ipv6(piVar3,(bool)(local_1a & 1));
    ip_resolver_options_t::expect_port(piVar3,true);
    local_7c = local_62[0]._dns_allowed;
    bStack_7b = local_62[0]._path_allowed;
    local_80._0_1_ = local_62[0]._bindable_wanted;
    local_80._1_1_ = local_62[0]._nic_name_allowed;
    local_80._2_1_ = local_62[0]._ipv6_wanted;
    local_80._3_1_ = local_62[0]._port_expected;
    local_84 = CONCAT22(local_84._2_2_,local_62[0]._4_2_);
    local_88._0_1_ = local_62[0]._bindable_wanted;
    local_88._1_1_ = local_62[0]._nic_name_allowed;
    local_88._2_1_ = local_62[0]._ipv6_wanted;
    local_88._3_1_ = local_62[0]._port_expected;
    ip_resolver_t::ip_resolver_t
              (&local_78,
               (ip_resolver_options_t)((uint6)(uint)local_62[0]._0_4_ | (uint6)local_84 << 0x20));
    std::__cxx11::string::c_str();
    local_8c = ip_resolver_t::resolve
                         ((ip_resolver_t *)CONCAT17(local_,CONCAT16(ipv6_,in_stack_00000108)),
                          (ip_addr_t *)src_delimiter,(char *)src_name.field_2._8_8_);
    if (local_8c == 0) {
      local_18 = local_28 + 1;
      *(undefined1 *)(in_RDI + 0x38) = 1;
    }
    else {
      local_4 = -1;
    }
    local_90 = (uint)(local_8c != 0);
    ip_resolver_t::~ip_resolver_t(&local_78);
    std::__cxx11::string::~string(local_48);
    if (local_90 != 0) {
      return local_4;
    }
  }
  ip_resolver_options_t::ip_resolver_options_t(&local_96);
  piVar3 = ip_resolver_options_t::bindable(&local_96,(bool)(local_19 & 1));
  piVar3 = ip_resolver_options_t::allow_dns(piVar3,(bool)(~local_19 & 1));
  piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,(bool)(local_19 & 1));
  piVar3 = ip_resolver_options_t::ipv6(piVar3,(bool)(local_1a & 1));
  ip_resolver_options_t::expect_port(piVar3,true);
  opts_._dns_allowed = local_96._dns_allowed;
  opts_._path_allowed = local_96._path_allowed;
  opts_._bindable_wanted = local_96._bindable_wanted;
  opts_._nic_name_allowed = local_96._nic_name_allowed;
  opts_._ipv6_wanted = local_96._ipv6_wanted;
  opts_._port_expected = local_96._port_expected;
  ip_resolver_t::ip_resolver_t(&local_a8,opts_);
  local_4 = ip_resolver_t::resolve
                      ((ip_resolver_t *)CONCAT17(local_,CONCAT16(ipv6_,in_stack_00000108)),
                       (ip_addr_t *)src_delimiter,(char *)src_name.field_2._8_8_);
  local_90 = 1;
  ip_resolver_t::~ip_resolver_t(&local_a8);
  return local_4;
}

Assistant:

int zmq::tcp_address_t::resolve (const char *name_, bool local_, bool ipv6_)
{
    // Test the ';' to know if we have a source address in name_
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (true);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc =
          src_resolver.resolve (&_source_address, src_name.c_str ());
        if (rc != 0)
            return -1;
        name_ = src_delimiter + 1;
        _has_src_addr = true;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (local_)
      .allow_dns (!local_)
      .allow_nic_name (local_)
      .ipv6 (ipv6_)
      .expect_port (true);

    ip_resolver_t resolver (resolver_opts);

    return resolver.resolve (&_address, name_);
}